

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O1

int mdb_freelist_save(MDB_txn *txn)

{
  MDB_env *pMVar1;
  MDB_ID MVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  MDB_ID *xidl;
  MDB_pgstate *pMVar7;
  pgno_t pVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  pgno_t *ppVar12;
  MDB_page *mp;
  MDB_page *pMVar13;
  int iVar14;
  ulong *ids;
  int in_R8D;
  ulong uVar15;
  MDB_IDL pMVar16;
  pgno_t pVar17;
  ulong uVar18;
  MDB_val data;
  MDB_val key;
  txnid_t head_id;
  txnid_t id;
  MDB_cursor mc;
  int local_234;
  pgno_t local_228;
  MDB_val local_218;
  MDB_val local_208;
  txnid_t local_1f8;
  pgno_t *local_1f0;
  long local_1e8;
  uint32_t local_1dc;
  MDB_pgstate *local_1d8;
  long local_1d0;
  txnid_t *local_1c8;
  ulong local_1c0;
  MDB_cursor local_1b8;
  
  pMVar1 = txn->mt_env;
  iVar14 = pMVar1->me_maxfree_1pg;
  local_1f8 = 0;
  mdb_cursor_init(&local_1b8,txn,0,(MDB_xcursor *)0x0);
  if ((((pMVar1->me_pgstate).mf_pghead == (pgno_t *)0x0) ||
      (local_234 = mdb_page_search(&local_1b8,(MDB_val *)0x0,5), local_234 == 0)) ||
     (local_234 == -0x784e)) {
    pMVar7 = &pMVar1->me_pgstate;
    local_1d8 = pMVar7;
    if ((pMVar7->mf_pghead == (pgno_t *)0x0) &&
       (pMVar13 = txn->mt_loose_pgs, pMVar13 != (MDB_page *)0x0)) {
      iVar5 = mdb_midl_need(&txn->mt_free_pgs,txn->mt_loose_count);
      if (iVar5 != 0) {
        return iVar5;
      }
      pMVar7 = (MDB_pgstate *)0x0;
      pMVar16 = txn->mt_free_pgs;
      do {
        MVar2 = *pMVar16;
        *pMVar16 = MVar2 + 1;
        *(anon_union_8_2_b62042e6_for_mp_p *)(pMVar16 + MVar2 + 1) = pMVar13->mp_p;
        pMVar13 = pMVar13[2].mp_p.p_next;
      } while (pMVar13 != (MDB_page *)0x0);
      txn->mt_loose_pgs = (MDB_page *)0x0;
      txn->mt_loose_count = 0;
    }
    local_234 = (int)pMVar7;
    local_1dc = pMVar1->me_flags;
    local_1d0 = (long)(iVar14 + 1);
    local_1c8 = &txn->mt_txnid;
    iVar5 = 1;
    uVar18 = 0;
    pVar17 = 0;
    uVar15 = 0;
    uVar10 = 0;
    local_1e8 = (long)iVar14;
LAB_00106ce4:
    do {
      if (uVar10 < (pMVar1->me_pgstate).mf_pglast) {
        iVar4 = mdb_cursor_first(&local_1b8,&local_208,(MDB_val *)0x0);
        if (iVar4 == 0) {
          uVar10 = *local_208.mv_data;
          local_1f8 = uVar10;
          if ((pMVar1->me_pgstate).mf_pglast < uVar10) {
            mdb_assert_fail(txn->mt_env,"pglast <= env->me_pglast","mdb_freelist_save",(char *)0xd0e
                            ,in_R8D);
          }
          iVar4 = mdb_cursor_del(&local_1b8,0);
          uVar18 = 0;
          pVar17 = 0;
          if (iVar4 == 0) goto LAB_00106ce4;
          uVar18 = 0;
          pVar17 = 0;
        }
LAB_00106d49:
        iVar14 = 1;
        local_234 = iVar4;
      }
      else if (uVar15 < *txn->mt_free_pgs) {
        if (((uVar15 == 0) && (iVar4 = mdb_page_search(&local_1b8,(MDB_val *)0x0,9), iVar4 != 0)) &&
           (iVar4 != -0x784e)) {
          uVar15 = 0;
          goto LAB_00106d49;
        }
        ids = txn->mt_free_pgs;
        local_208.mv_size = 8;
        local_208.mv_data = local_1c8;
        do {
          uVar15 = *ids;
          local_218.mv_size = uVar15 * 8 + 8;
          iVar4 = mdb_cursor_put(&local_1b8,&local_208,&local_218,0x10000);
          if (iVar4 != 0) goto LAB_00106d49;
          ids = txn->mt_free_pgs;
        } while (uVar15 < *ids);
        mdb_midl_sort(ids);
        memcpy(local_218.mv_data,ids,local_218.mv_size);
        iVar14 = 8;
      }
      else {
        local_1f0 = local_1d8->mf_pghead;
        if (local_1f0 == (pgno_t *)0x0) {
          pVar8 = 0;
        }
        else {
          pVar8 = *local_1f0;
        }
        local_228 = (long)txn->mt_loose_count + pVar8;
        if ((long)pVar17 < (long)local_228) {
          if (1 < local_1f8 && local_1e8 <= (long)uVar18) {
            local_1f8 = local_1f8 - 1;
            uVar18 = 0;
          }
        }
        else {
          iVar14 = 7;
          if ((pVar17 == local_228) ||
             (iVar4 = iVar5 + -1, bVar3 = iVar5 < 1, iVar14 = 7, iVar5 = iVar4, bVar3))
          goto LAB_00106d4d;
        }
        pVar17 = pVar17 - uVar18;
        uVar18 = local_228 - pVar17;
        if (local_1f8 < 2 || (long)uVar18 <= local_1e8) {
          if ((long)uVar18 < 1) {
            uVar18 = 0;
          }
        }
        else {
          uVar18 = (uVar18 / local_1f8 + local_1e8) - (long)(uVar18 / local_1f8) % local_1d0;
        }
        local_208.mv_size = 8;
        local_208.mv_data = &local_1f8;
        local_218.mv_size = uVar18 * 8 + 8;
        iVar4 = mdb_cursor_put(&local_1b8,&local_208,&local_218,0x10000);
        if (iVar4 != 0) goto LAB_00106d49;
        uVar9 = 0;
        if (local_1e8 < (long)uVar18) {
          uVar9 = uVar18;
        }
        if ((local_1dc & 0x1080000) != 0) {
          uVar9 = 0;
        }
        uVar11 = (long)uVar9 >> 0x3f & uVar9;
        memset((pgno_t *)((long)local_218.mv_data + uVar11 * 8),0,(uVar9 - uVar11) * 8 + 8);
        pVar17 = pVar17 + uVar18;
        iVar14 = 0;
      }
LAB_00106d4d:
      pMVar7 = local_1d8;
    } while ((iVar14 == 0) || (iVar14 == 8));
    if (iVar14 == 7) {
      pMVar13 = txn->mt_loose_pgs;
      ppVar12 = local_1f0;
      if (pMVar13 != (MDB_page *)0x0) {
        uVar6 = txn->mt_loose_count;
        iVar5 = mdb_midl_need(&local_1d8->mf_pghead,uVar6 * 2 + 1);
        ppVar12 = local_1f0;
        iVar14 = iVar5;
        if (iVar5 == 0) {
          local_1f0 = pMVar7->mf_pghead;
          pMVar16 = local_1f0 + (local_1f0[-1] - (ulong)uVar6);
          uVar10 = 0;
          do {
            uVar6 = (int)uVar10 + 1;
            uVar10 = (ulong)uVar6;
            *(anon_union_8_2_b62042e6_for_mp_p *)(pMVar16 + uVar10) = pMVar13->mp_p;
            pMVar13 = pMVar13[2].mp_p.p_next;
          } while (pMVar13 != (MDB_page *)0x0);
          *pMVar16 = (ulong)uVar6;
          mdb_midl_sort(pMVar16);
          ppVar12 = local_1f0;
          mdb_midl_xmerge(local_1f0,pMVar16);
          txn->mt_loose_pgs = (MDB_page *)0x0;
          txn->mt_loose_count = 0;
          local_228 = *ppVar12;
          iVar14 = local_234;
        }
        if (iVar5 != 0) {
          return iVar14;
        }
      }
      if (local_228 == 0) {
        local_234 = 0;
      }
      else {
        local_234 = mdb_cursor_first(&local_1b8,&local_208,&local_218);
        if (local_234 == 0) {
          ppVar12 = ppVar12 + local_228;
          do {
            local_1c0 = *local_208.mv_data;
            if ((local_218.mv_size < 8) || ((pMVar1->me_pgstate).mf_pglast < local_1c0)) {
              mdb_assert_fail(txn->mt_env,"len >= 0 && id <= env->me_pglast","mdb_freelist_save",
                              (char *)0xd82,in_R8D);
            }
            pVar17 = (local_218.mv_size >> 3) - 1;
            local_208.mv_data = &local_1c0;
            if ((long)local_228 < (long)pVar17) {
              local_218.mv_size = local_228 * 8 + 8;
              pVar17 = local_228;
            }
            ppVar12 = ppVar12 + -pVar17;
            pVar8 = *ppVar12;
            *ppVar12 = pVar17;
            local_218.mv_data = ppVar12;
            local_234 = mdb_cursor_put(&local_1b8,&local_208,&local_218,0x40);
            *ppVar12 = pVar8;
          } while (((local_234 == 0) && (local_228 = local_228 - pVar17, local_228 != 0)) &&
                  (local_234 = mdb_cursor_next(&local_1b8,&local_208,&local_218,MDB_NEXT),
                  local_234 == 0));
        }
      }
    }
  }
  return local_234;
}

Assistant:

static int
mdb_freelist_save(MDB_txn *txn)
{
	/* env->me_pghead[] can grow and shrink during this call.
	 * env->me_pglast and txn->mt_free_pgs[] can only grow.
	 * Page numbers cannot disappear from txn->mt_free_pgs[].
	 */
	MDB_cursor mc;
	MDB_env	*env = txn->mt_env;
	int rc, maxfree_1pg = env->me_maxfree_1pg, more = 1;
	txnid_t	pglast = 0, head_id = 0;
	pgno_t	freecnt = 0, *free_pgs, *mop;
	ssize_t	head_room = 0, total_room = 0, mop_len, clean_limit;

	mdb_cursor_init(&mc, txn, FREE_DBI, NULL);

	if (env->me_pghead) {
		/* Make sure first page of freeDB is touched and on freelist */
		rc = mdb_page_search(&mc, NULL, MDB_PS_FIRST|MDB_PS_MODIFY);
		if (rc && rc != MDB_NOTFOUND)
			return rc;
	}

	if (!env->me_pghead && txn->mt_loose_pgs) {
		/* Put loose page numbers in mt_free_pgs, since
		 * we may be unable to return them to me_pghead.
		 */
		MDB_page *mp = txn->mt_loose_pgs;
		if ((rc = mdb_midl_need(&txn->mt_free_pgs, txn->mt_loose_count)) != 0)
			return rc;
		for (; mp; mp = NEXT_LOOSE_PAGE(mp))
			mdb_midl_xappend(txn->mt_free_pgs, mp->mp_pgno);
		txn->mt_loose_pgs = NULL;
		txn->mt_loose_count = 0;
	}

	/* MDB_RESERVE cancels meminit in ovpage malloc (when no WRITEMAP) */
	clean_limit = (env->me_flags & (MDB_NOMEMINIT|MDB_WRITEMAP))
		? SSIZE_MAX : maxfree_1pg;

	for (;;) {
		/* Come back here after each Put() in case freelist changed */
		MDB_val key, data;
		pgno_t *pgs;
		ssize_t j;

		/* If using records from freeDB which we have not yet
		 * deleted, delete them and any we reserved for me_pghead.
		 */
		while (pglast < env->me_pglast) {
			rc = mdb_cursor_first(&mc, &key, NULL);
			if (rc)
				return rc;
			pglast = head_id = *(txnid_t *)key.mv_data;
			total_room = head_room = 0;
			mdb_tassert(txn, pglast <= env->me_pglast);
			rc = mdb_cursor_del(&mc, 0);
			if (rc)
				return rc;
		}

		/* Save the IDL of pages freed by this txn, to a single record */
		if (freecnt < txn->mt_free_pgs[0]) {
			if (!freecnt) {
				/* Make sure last page of freeDB is touched and on freelist */
				rc = mdb_page_search(&mc, NULL, MDB_PS_LAST|MDB_PS_MODIFY);
				if (rc && rc != MDB_NOTFOUND)
					return rc;
			}
			free_pgs = txn->mt_free_pgs;
			/* Write to last page of freeDB */
			key.mv_size = sizeof(txn->mt_txnid);
			key.mv_data = &txn->mt_txnid;
			do {
				freecnt = free_pgs[0];
				data.mv_size = MDB_IDL_SIZEOF(free_pgs);
				rc = mdb_cursor_put(&mc, &key, &data, MDB_RESERVE);
				if (rc)
					return rc;
				/* Retry if mt_free_pgs[] grew during the Put() */
				free_pgs = txn->mt_free_pgs;
			} while (freecnt < free_pgs[0]);
			mdb_midl_sort(free_pgs);
			memcpy(data.mv_data, free_pgs, data.mv_size);
#if (MDB_DEBUG) > 1
			{
				unsigned int i = free_pgs[0];
				DPRINTF(("IDL write txn %"Y"u root %"Y"u num %u",
					txn->mt_txnid, txn->mt_dbs[FREE_DBI].md_root, i));
				for (; i; i--)
					DPRINTF(("IDL %"Y"u", free_pgs[i]));
			}
#endif
			continue;
		}

		mop = env->me_pghead;
		mop_len = (mop ? mop[0] : 0) + txn->mt_loose_count;

		/* Reserve records for me_pghead[]. Split it if multi-page,
		 * to avoid searching freeDB for a page range. Use keys in
		 * range [1,me_pglast]: Smaller than txnid of oldest reader.
		 */
		if (total_room >= mop_len) {
			if (total_room == mop_len || --more < 0)
				break;
		} else if (head_room >= maxfree_1pg && head_id > 1) {
			/* Keep current record (overflow page), add a new one */
			head_id--;
			head_room = 0;
		}
		/* (Re)write {key = head_id, IDL length = head_room} */
		total_room -= head_room;
		head_room = mop_len - total_room;
		if (head_room > maxfree_1pg && head_id > 1) {
			/* Overflow multi-page for part of me_pghead */
			head_room /= head_id; /* amortize page sizes */
			head_room += maxfree_1pg - head_room % (maxfree_1pg + 1);
		} else if (head_room < 0) {
			/* Rare case, not bothering to delete this record */
			head_room = 0;
		}
		key.mv_size = sizeof(head_id);
		key.mv_data = &head_id;
		data.mv_size = (head_room + 1) * sizeof(pgno_t);
		rc = mdb_cursor_put(&mc, &key, &data, MDB_RESERVE);
		if (rc)
			return rc;
		/* IDL is initially empty, zero out at least the length */
		pgs = (pgno_t *)data.mv_data;
		j = head_room > clean_limit ? head_room : 0;
		do {
			pgs[j] = 0;
		} while (--j >= 0);
		total_room += head_room;
	}

	/* Return loose page numbers to me_pghead, though usually none are
	 * left at this point.  The pages themselves remain in dirty_list.
	 */
	if (txn->mt_loose_pgs) {
		MDB_page *mp = txn->mt_loose_pgs;
		unsigned count = txn->mt_loose_count;
		MDB_IDL loose;
		/* Room for loose pages + temp IDL with same */
		if ((rc = mdb_midl_need(&env->me_pghead, 2*count+1)) != 0)
			return rc;
		mop = env->me_pghead;
		loose = mop + MDB_IDL_ALLOCLEN(mop) - count;
		for (count = 0; mp; mp = NEXT_LOOSE_PAGE(mp))
			loose[ ++count ] = mp->mp_pgno;
		loose[0] = count;
		mdb_midl_sort(loose);
		mdb_midl_xmerge(mop, loose);
		txn->mt_loose_pgs = NULL;
		txn->mt_loose_count = 0;
		mop_len = mop[0];
	}

	/* Fill in the reserved me_pghead records */
	rc = MDB_SUCCESS;
	if (mop_len) {
		MDB_val key, data;

		mop += mop_len;
		rc = mdb_cursor_first(&mc, &key, &data);
		for (; !rc; rc = mdb_cursor_next(&mc, &key, &data, MDB_NEXT)) {
			txnid_t id = *(txnid_t *)key.mv_data;
			ssize_t	len = (ssize_t)(data.mv_size / sizeof(MDB_ID)) - 1;
			MDB_ID save;

			mdb_tassert(txn, len >= 0 && id <= env->me_pglast);
			key.mv_data = &id;
			if (len > mop_len) {
				len = mop_len;
				data.mv_size = (len + 1) * sizeof(MDB_ID);
			}
			data.mv_data = mop -= len;
			save = mop[0];
			mop[0] = len;
			rc = mdb_cursor_put(&mc, &key, &data, MDB_CURRENT);
			mop[0] = save;
			if (rc || !(mop_len -= len))
				break;
		}
	}
	return rc;
}